

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_4::readPixels(Functions *gl,EGLint api,Surface *dst)

{
  NotSupportedError *this;
  allocator<char> local_41;
  string local_40;
  Surface *local_20;
  Surface *dst_local;
  Functions *pFStack_10;
  EGLint api_local;
  Functions *gl_local;
  
  local_20 = dst;
  dst_local._4_4_ = api;
  pFStack_10 = gl;
  if (api == 4) {
    readPixelsGLES2(gl,dst);
  }
  else {
    if (api != 0x40) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Unsupported API",&local_41);
      tcu::NotSupportedError::NotSupportedError(this,&local_40);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
      ;
    }
    readPixelsGLES2(gl,dst);
  }
  return;
}

Assistant:

static void readPixels (const glw::Functions& gl, EGLint api, tcu::Surface& dst)
{
	switch (api)
	{
		case EGL_OPENGL_ES2_BIT:		readPixelsGLES2(gl, dst);		break;
		case EGL_OPENGL_ES3_BIT_KHR:	readPixelsGLES2(gl, dst);		break;
		default:
			throw tcu::NotSupportedError("Unsupported API");
	}
}